

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O2

void __thiscall PSVIWriterHandlers::endPrefixMapping(PSVIWriterHandlers *this,XMLCh *prefix)

{
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *this_00;
  bool bVar1;
  char16_t *pcVar2;
  uint uVar3;
  ulong getAt;
  XMLCh *pre;
  XMLCh *uri;
  char16_t *local_38;
  char16_t *local_30;
  
  uVar3 = 0;
  do {
    getAt = (ulong)uVar3;
    if ((this->fNamespaces->super_BaseRefVectorOf<char16_t>).fCurCount <= getAt) {
      return;
    }
    this_00 = this->fPrefixMap;
    pcVar2 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                       (&this->fNamespaces->super_BaseRefVectorOf<char16_t>,getAt);
    pcVar2 = xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get(this_00,pcVar2);
    bVar1 = xercesc_4_0::XMLString::equals(pcVar2,prefix);
    uVar3 = uVar3 + 1;
  } while (!bVar1);
  pcVar2 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                     (&this->fNamespaces->super_BaseRefVectorOf<char16_t>,getAt);
  local_30 = pcVar2;
  local_38 = xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get
                       (this->fPrefixMap,pcVar2);
  xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::removeKey
            (this->fPrefixMap,pcVar2);
  (*(this->fNamespaces->super_BaseRefVectorOf<char16_t>)._vptr_BaseRefVectorOf[4])
            (this->fNamespaces,getAt);
  xercesc_4_0::XMLString::release(&local_30,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release(&local_38,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return;
}

Assistant:

void PSVIWriterHandlers::endPrefixMapping(const XMLCh* const prefix) {
	for (unsigned int i=0; i < fNamespaces->size(); i++) {
		if (XMLString::equals(fPrefixMap->get(fNamespaces->elementAt(i)), prefix)) {
			XMLCh* uri = fNamespaces->elementAt(i);
			XMLCh* pre = fPrefixMap->get(uri);
			fPrefixMap->removeKey(uri);
			fNamespaces->removeElementAt(i);
			XMLString::release(&uri);
			XMLString::release(&pre);
			break;
		}
	}
}